

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void aom_lowbd_blend_a64_d16_mask_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  CONV_BUF_TYPE *pCVar1;
  uint8_t *puVar2;
  CONV_BUF_TYPE *pCVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint8_t *puVar12;
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  unkint10 Var21;
  byte bVar37;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  short sVar69;
  short sVar70;
  short sVar71;
  ushort uVar74;
  ushort uVar76;
  ushort uVar78;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar72;
  ushort uVar80;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  short sVar73;
  short sVar75;
  short sVar77;
  short sVar79;
  short sVar81;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  ushort uVar82;
  short sVar83;
  ushort uVar102;
  ushort uVar105;
  ushort uVar108;
  ushort uVar111;
  ushort uVar113;
  ushort uVar115;
  undefined1 in_XMM6 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  ushort uVar103;
  ushort uVar106;
  ushort uVar109;
  ushort uVar117;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  short sVar104;
  short sVar107;
  short sVar110;
  short sVar112;
  short sVar114;
  short sVar116;
  short sVar118;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar119 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar210 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar49 [16];
  undefined1 auVar65 [16];
  undefined1 auVar50 [16];
  undefined1 auVar66 [16];
  undefined1 auVar51 [16];
  undefined1 auVar67 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar135 [16];
  undefined1 auVar140 [16];
  undefined1 auVar145 [16];
  undefined1 auVar151 [16];
  undefined1 auVar136 [16];
  undefined1 auVar141 [16];
  undefined1 auVar146 [16];
  undefined1 auVar152 [16];
  undefined1 auVar137 [16];
  undefined1 auVar142 [16];
  undefined1 auVar147 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar184 [16];
  undefined1 auVar161 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar180 [16];
  undefined1 auVar158 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar162 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar181 [16];
  undefined1 auVar187 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar163 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar182 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  undefined1 auVar200 [16];
  undefined1 auVar204 [16];
  undefined1 auVar201 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar211 [16];
  undefined1 auVar208 [16];
  undefined1 auVar212 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [16];
  
  auVar14 = _DAT_004ce390;
  uVar6 = (ulong)src0_stride;
  iVar9 = conv_params->round_1 + conv_params->round_0;
  cVar8 = (char)iVar9;
  iVar10 = (-1 << (0xdU - cVar8 & 0x1f)) +
           (1 << (0x15U - cVar8 & 0x1f)) + (1 << (0x16U - cVar8 & 0x1f));
  uVar7 = 0x14 - iVar9;
  if (subh == 0 && subw == 0) {
    if (w == 8) {
      if (0 < h) {
        auVar14 = pmovsxbw(in_XMM1,0x4040404040404040);
        auVar13 = ZEXT416(uVar7);
        do {
          auVar22 = pmovzxbw(in_XMM3,*(undefined8 *)mask);
          auVar15 = *(undefined1 (*) [16])src0;
          auVar96._0_12_ = auVar15._0_12_;
          auVar96._12_2_ = auVar15._6_2_;
          auVar96._14_2_ = src1[3];
          auVar192._12_4_ = auVar96._12_4_;
          auVar192._0_10_ = auVar15._0_10_;
          auVar192._10_2_ = src1[2];
          auVar94._10_6_ = auVar192._10_6_;
          auVar94._0_8_ = auVar15._0_8_;
          auVar94._8_2_ = auVar15._4_2_;
          auVar129._8_8_ = auVar94._8_8_;
          auVar129._6_2_ = src1[1];
          auVar129._4_2_ = auVar15._2_2_;
          auVar129._0_2_ = auVar15._0_2_;
          auVar129._2_2_ = *src1;
          auVar137._0_12_ = auVar22._0_12_;
          auVar137._12_2_ = auVar22._6_2_;
          auVar137._14_2_ = auVar14._6_2_ - auVar22._6_2_;
          auVar136._12_4_ = auVar137._12_4_;
          auVar136._0_10_ = auVar22._0_10_;
          auVar136._10_2_ = auVar14._4_2_ - auVar22._4_2_;
          auVar135._10_6_ = auVar136._10_6_;
          auVar135._0_8_ = auVar22._0_8_;
          auVar135._8_2_ = auVar22._4_2_;
          auVar134._8_8_ = auVar135._8_8_;
          auVar134._6_2_ = auVar14._2_2_ - auVar22._2_2_;
          auVar134._4_2_ = auVar22._2_2_;
          auVar134._2_2_ = auVar14._0_2_ - auVar22._0_2_;
          auVar134._0_2_ = auVar22._0_2_;
          auVar94 = pmaddwd(auVar134,auVar129);
          auVar85._2_2_ = src1[4];
          auVar85._0_2_ = auVar15._8_2_;
          auVar85._4_2_ = auVar15._10_2_;
          auVar85._6_2_ = src1[5];
          auVar85._8_2_ = auVar15._12_2_;
          auVar85._10_2_ = src1[6];
          auVar85._12_2_ = auVar15._14_2_;
          auVar85._14_2_ = src1[7];
          auVar15._2_2_ = auVar14._8_2_ - auVar22._8_2_;
          auVar15._0_2_ = auVar22._8_2_;
          auVar15._4_2_ = auVar22._10_2_;
          auVar15._6_2_ = auVar14._10_2_ - auVar22._10_2_;
          auVar15._8_2_ = auVar22._12_2_;
          auVar15._10_2_ = auVar14._12_2_ - auVar22._12_2_;
          auVar15._12_2_ = auVar22._14_2_;
          auVar15._14_2_ = auVar14._14_2_ - auVar22._14_2_;
          auVar22._0_4_ = auVar94._0_4_ + iVar10 * -0x40 >> auVar13;
          auVar22._4_4_ = auVar94._4_4_ + iVar10 * -0x40 >> auVar13;
          auVar22._8_4_ = auVar94._8_4_ + iVar10 * -0x40 >> auVar13;
          auVar22._12_4_ = auVar94._12_4_ + iVar10 * -0x40 >> auVar13;
          auVar15 = pmaddwd(auVar15,auVar85);
          in_XMM3._0_4_ = auVar15._0_4_ + iVar10 * -0x40 >> auVar13;
          in_XMM3._4_4_ = auVar15._4_4_ + iVar10 * -0x40 >> auVar13;
          in_XMM3._8_4_ = auVar15._8_4_ + iVar10 * -0x40 >> auVar13;
          in_XMM3._12_4_ = auVar15._12_4_ + iVar10 * -0x40 >> auVar13;
          auVar15 = packssdw(auVar22,in_XMM3);
          sVar69 = auVar15._0_2_;
          sVar70 = auVar15._2_2_;
          sVar71 = auVar15._4_2_;
          sVar73 = auVar15._6_2_;
          sVar75 = auVar15._8_2_;
          sVar77 = auVar15._10_2_;
          sVar79 = auVar15._12_2_;
          sVar81 = auVar15._14_2_;
          *(ulong *)dst =
               CONCAT17((0 < sVar81) * (sVar81 < 0x100) * auVar15[0xe] - (0xff < sVar81),
                        CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar15[0xc] - (0xff < sVar79),
                                 CONCAT15((0 < sVar77) * (sVar77 < 0x100) * auVar15[10] -
                                          (0xff < sVar77),
                                          CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar15[8] -
                                                   (0xff < sVar75),
                                                   CONCAT13((0 < sVar73) * (sVar73 < 0x100) *
                                                            auVar15[6] - (0xff < sVar73),
                                                            CONCAT12((0 < sVar71) * (sVar71 < 0x100)
                                                                     * auVar15[4] - (0xff < sVar71),
                                                                     CONCAT11((0 < sVar70) *
                                                                              (sVar70 < 0x100) *
                                                                              auVar15[2] -
                                                                              (0xff < sVar70),
                                                                              (0 < sVar69) *
                                                                              (sVar69 < 0x100) *
                                                                              auVar15[0] -
                                                                              (0xff < sVar69))))))))
          ;
          mask = mask + mask_stride;
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar6 * 2);
          src1 = src1 + src1_stride;
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      if (0 < h) {
        auVar14 = pmovsxbw(in_XMM1,0x4040404040404040);
        auVar13 = ZEXT416(uVar7);
        do {
          auVar15 = pmovzxbw(ZEXT416(*(uint *)mask),ZEXT416(*(uint *)mask));
          auVar16._0_2_ = auVar15._0_2_;
          uVar4 = *(ulong *)src0;
          uVar5 = *(undefined8 *)src1;
          auVar42._8_4_ = 0;
          auVar42._0_8_ = uVar4;
          auVar42._12_2_ = (short)(uVar4 >> 0x30);
          auVar42._14_2_ = (short)((ulong)uVar5 >> 0x30);
          auVar41._12_4_ = auVar42._12_4_;
          auVar41._8_2_ = 0;
          auVar41._0_8_ = uVar4;
          auVar41._10_2_ = (short)((ulong)uVar5 >> 0x20);
          auVar40._10_6_ = auVar41._10_6_;
          auVar40._8_2_ = (short)(uVar4 >> 0x20);
          auVar40._0_8_ = uVar4;
          auVar39._8_8_ = auVar40._8_8_;
          auVar39._6_2_ = (short)((ulong)uVar5 >> 0x10);
          auVar39._4_2_ = (short)(uVar4 >> 0x10);
          auVar39._0_2_ = (undefined2)uVar4;
          auVar39._2_2_ = (short)uVar5;
          auVar19._0_12_ = auVar15._0_12_;
          auVar19._12_2_ = auVar15._6_2_;
          auVar19._14_2_ = auVar14._6_2_ - auVar15._6_2_;
          auVar18._12_4_ = auVar19._12_4_;
          auVar18._0_10_ = auVar15._0_10_;
          auVar18._10_2_ = auVar14._4_2_ - auVar15._4_2_;
          auVar17._10_6_ = auVar18._10_6_;
          auVar17._0_8_ = auVar15._0_8_;
          auVar17._8_2_ = auVar15._4_2_;
          auVar16._8_8_ = auVar17._8_8_;
          auVar16._6_2_ = auVar14._2_2_ - auVar15._2_2_;
          auVar16._4_2_ = auVar15._2_2_;
          auVar16._2_2_ = auVar14._0_2_ - auVar16._0_2_;
          auVar15 = pmaddwd(auVar16,auVar39);
          auVar20._0_4_ = auVar15._0_4_ + iVar10 * -0x40 >> auVar13;
          auVar20._4_4_ = auVar15._4_4_ + iVar10 * -0x40 >> auVar13;
          auVar20._8_4_ = auVar15._8_4_ + iVar10 * -0x40 >> auVar13;
          auVar20._12_4_ = auVar15._12_4_ + iVar10 * -0x40 >> auVar13;
          auVar15 = packssdw(auVar20,auVar20);
          sVar69 = auVar15._0_2_;
          sVar70 = auVar15._2_2_;
          sVar71 = auVar15._4_2_;
          sVar73 = auVar15._6_2_;
          *(uint *)dst = CONCAT13((0 < sVar73) * (sVar73 < 0x100) * auVar15[6] - (0xff < sVar73),
                                  CONCAT12((0 < sVar71) * (sVar71 < 0x100) * auVar15[4] -
                                           (0xff < sVar71),
                                           CONCAT11((0 < sVar70) * (sVar70 < 0x100) * auVar15[2] -
                                                    (0xff < sVar70),
                                                    (0 < sVar69) * (sVar69 < 0x100) * auVar15[0] -
                                                    (0xff < sVar69))));
          mask = (uint8_t *)((long)mask + (ulong)mask_stride);
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)((long)src0 + uVar6 * 2);
          src1 = src1 + src1_stride;
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (0 < h) {
      iVar9 = 0;
      auVar14 = pmovsxbw(in_XMM2,0x4040404040404040);
      auVar13 = ZEXT416(uVar7);
      do {
        if (0 < w) {
          lVar11 = 0;
          do {
            auVar15 = *(undefined1 (*) [16])(mask + lVar11);
            auVar96 = pmovzxbw(in_XMM6,auVar15);
            uVar102 = CONCAT11(0,auVar15[8]);
            Var21 = (unkuint10)auVar15[0xc] << 0x40;
            bVar37 = auVar15[0xd];
            auVar158[10] = bVar37;
            auVar158._0_10_ = Var21;
            auVar158[0xb] = 0;
            auVar22 = *(undefined1 (*) [16])(src0 + lVar11);
            auVar85 = *(undefined1 (*) [16])(src0 + lVar11 + 8);
            pCVar1 = src1 + lVar11;
            pCVar3 = src1 + lVar11 + 8;
            uVar105 = CONCAT11(0,auVar15[0xc]);
            auVar201._0_12_ = auVar22._0_12_;
            auVar201._12_2_ = auVar22._6_2_;
            auVar201._14_2_ = pCVar1[3];
            auVar200._12_4_ = auVar201._12_4_;
            auVar200._0_10_ = auVar22._0_10_;
            auVar200._10_2_ = pCVar1[2];
            auVar199._10_6_ = auVar200._10_6_;
            auVar199._0_8_ = auVar22._0_8_;
            auVar199._8_2_ = auVar22._4_2_;
            auVar198._8_8_ = auVar199._8_8_;
            auVar198._6_2_ = pCVar1[1];
            auVar198._4_2_ = auVar22._2_2_;
            auVar198._0_2_ = auVar22._0_2_;
            auVar198._2_2_ = *pCVar1;
            auVar51._0_12_ = auVar96._0_12_;
            auVar51._12_2_ = auVar96._6_2_;
            auVar51._14_2_ = auVar14._6_2_ - auVar96._6_2_;
            auVar50._12_4_ = auVar51._12_4_;
            auVar50._0_10_ = auVar96._0_10_;
            auVar50._10_2_ = auVar14._4_2_ - auVar96._4_2_;
            auVar49._10_6_ = auVar50._10_6_;
            auVar49._0_8_ = auVar96._0_8_;
            auVar49._8_2_ = auVar96._4_2_;
            auVar48._8_8_ = auVar49._8_8_;
            auVar48._6_2_ = auVar14._2_2_ - auVar96._2_2_;
            auVar48._4_2_ = auVar96._2_2_;
            auVar48._2_2_ = auVar14._0_2_ - auVar96._0_2_;
            auVar48._0_2_ = auVar96._0_2_;
            auVar94 = pmaddwd(auVar48,auVar198);
            auVar138._2_2_ = pCVar1[4];
            auVar138._0_2_ = auVar22._8_2_;
            auVar138._4_2_ = auVar22._10_2_;
            auVar138._6_2_ = pCVar1[5];
            auVar138._8_2_ = auVar22._12_2_;
            auVar138._10_2_ = pCVar1[6];
            auVar138._12_2_ = auVar22._14_2_;
            auVar138._14_2_ = pCVar1[7];
            auVar92._2_2_ = auVar14._8_2_ - auVar96._8_2_;
            auVar92._0_2_ = auVar96._8_2_;
            auVar92._4_2_ = auVar96._10_2_;
            auVar92._6_2_ = auVar14._10_2_ - auVar96._10_2_;
            auVar92._8_2_ = auVar96._12_2_;
            auVar92._10_2_ = auVar14._12_2_ - auVar96._12_2_;
            auVar92._12_2_ = auVar96._14_2_;
            auVar92._14_2_ = auVar14._14_2_ - auVar96._14_2_;
            auVar22 = pmaddwd(auVar92,auVar138);
            auVar142._0_12_ = auVar85._0_12_;
            auVar142._12_2_ = auVar85._6_2_;
            auVar142._14_2_ = pCVar3[3];
            auVar141._12_4_ = auVar142._12_4_;
            auVar141._0_10_ = auVar85._0_10_;
            auVar141._10_2_ = pCVar3[2];
            auVar140._10_6_ = auVar141._10_6_;
            auVar140._0_8_ = auVar85._0_8_;
            auVar140._8_2_ = auVar85._4_2_;
            auVar139._8_8_ = auVar140._8_8_;
            auVar139._6_2_ = pCVar3[1];
            auVar139._4_2_ = auVar85._2_2_;
            auVar139._0_2_ = auVar85._0_2_;
            auVar139._2_2_ = *pCVar3;
            auVar158[0xc] = auVar15[0xb];
            auVar158[0xd] = 0;
            auVar158._14_2_ = auVar14._6_2_ - (ushort)auVar15[0xb];
            auVar157._12_4_ = auVar158._12_4_;
            auVar157._10_2_ = auVar14._4_2_ - (ushort)auVar15[10];
            auVar157._0_10_ = Var21;
            auVar156._10_6_ = auVar157._10_6_;
            auVar156._0_10_ = (unkuint10)auVar15[10] << 0x40;
            auVar155._8_8_ = auVar156._8_8_;
            auVar155._6_2_ = auVar14._2_2_ - (ushort)auVar15[9];
            auVar155._0_6_ = (uint6)auVar15[9] << 0x20;
            auVar154._4_12_ = auVar155._4_12_;
            auVar154._2_2_ = auVar14._0_2_ - uVar102;
            auVar154._0_2_ = uVar102;
            auVar96 = pmaddwd(auVar154,auVar139);
            auVar127._2_2_ = pCVar3[4];
            auVar127._0_2_ = auVar85._8_2_;
            auVar127._4_2_ = auVar85._10_2_;
            auVar127._6_2_ = pCVar3[5];
            auVar127._8_2_ = auVar85._12_2_;
            auVar127._10_2_ = pCVar3[6];
            auVar127._12_2_ = auVar85._14_2_;
            auVar127._14_2_ = pCVar3[7];
            auVar29._2_2_ = auVar14._8_2_ - uVar105;
            auVar29._0_2_ = uVar105;
            auVar29[4] = bVar37;
            auVar29[5] = 0;
            auVar29._6_2_ = auVar14._10_2_ - (ushort)bVar37;
            auVar29[8] = auVar15[0xe];
            auVar29[9] = 0;
            auVar29._10_2_ = auVar14._12_2_ - (ushort)auVar15[0xe];
            auVar29[0xc] = auVar15[0xf];
            auVar29[0xd] = 0;
            auVar29._14_2_ = auVar14._14_2_ - (ushort)auVar15[0xf];
            auVar52._0_4_ = auVar94._0_4_ + iVar10 * -0x40 >> auVar13;
            auVar52._4_4_ = auVar94._4_4_ + iVar10 * -0x40 >> auVar13;
            auVar52._8_4_ = auVar94._8_4_ + iVar10 * -0x40 >> auVar13;
            auVar52._12_4_ = auVar94._12_4_ + iVar10 * -0x40 >> auVar13;
            auVar15 = pmaddwd(auVar29,auVar127);
            in_XMM6._0_4_ = auVar22._0_4_ + iVar10 * -0x40 >> auVar13;
            in_XMM6._4_4_ = auVar22._4_4_ + iVar10 * -0x40 >> auVar13;
            in_XMM6._8_4_ = auVar22._8_4_ + iVar10 * -0x40 >> auVar13;
            in_XMM6._12_4_ = auVar22._12_4_ + iVar10 * -0x40 >> auVar13;
            auVar22 = packssdw(auVar52,in_XMM6);
            auVar159._0_4_ = auVar96._0_4_ + iVar10 * -0x40 >> auVar13;
            auVar159._4_4_ = auVar96._4_4_ + iVar10 * -0x40 >> auVar13;
            auVar159._8_4_ = auVar96._8_4_ + iVar10 * -0x40 >> auVar13;
            auVar159._12_4_ = auVar96._12_4_ + iVar10 * -0x40 >> auVar13;
            auVar30._0_4_ = auVar15._0_4_ + iVar10 * -0x40 >> auVar13;
            auVar30._4_4_ = auVar15._4_4_ + iVar10 * -0x40 >> auVar13;
            auVar30._8_4_ = auVar15._8_4_ + iVar10 * -0x40 >> auVar13;
            auVar30._12_4_ = auVar15._12_4_ + iVar10 * -0x40 >> auVar13;
            auVar15 = packssdw(auVar159,auVar30);
            sVar69 = auVar22._0_2_;
            sVar70 = auVar22._2_2_;
            sVar71 = auVar22._4_2_;
            sVar73 = auVar22._6_2_;
            sVar75 = auVar22._8_2_;
            sVar77 = auVar22._10_2_;
            sVar79 = auVar22._12_2_;
            sVar81 = auVar22._14_2_;
            sVar83 = auVar15._0_2_;
            sVar104 = auVar15._2_2_;
            sVar107 = auVar15._4_2_;
            sVar110 = auVar15._6_2_;
            sVar112 = auVar15._8_2_;
            sVar114 = auVar15._10_2_;
            sVar116 = auVar15._12_2_;
            sVar118 = auVar15._14_2_;
            puVar12 = dst + lVar11;
            *puVar12 = (0 < sVar69) * (sVar69 < 0x100) * auVar22[0] - (0xff < sVar69);
            puVar12[1] = (0 < sVar70) * (sVar70 < 0x100) * auVar22[2] - (0xff < sVar70);
            puVar12[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar22[4] - (0xff < sVar71);
            puVar12[3] = (0 < sVar73) * (sVar73 < 0x100) * auVar22[6] - (0xff < sVar73);
            puVar12[4] = (0 < sVar75) * (sVar75 < 0x100) * auVar22[8] - (0xff < sVar75);
            puVar12[5] = (0 < sVar77) * (sVar77 < 0x100) * auVar22[10] - (0xff < sVar77);
            puVar12[6] = (0 < sVar79) * (sVar79 < 0x100) * auVar22[0xc] - (0xff < sVar79);
            puVar12[7] = (0 < sVar81) * (sVar81 < 0x100) * auVar22[0xe] - (0xff < sVar81);
            puVar12[8] = (0 < sVar83) * (sVar83 < 0x100) * auVar15[0] - (0xff < sVar83);
            puVar12[9] = (0 < sVar104) * (sVar104 < 0x100) * auVar15[2] - (0xff < sVar104);
            puVar12[10] = (0 < sVar107) * (sVar107 < 0x100) * auVar15[4] - (0xff < sVar107);
            puVar12[0xb] = (0 < sVar110) * (sVar110 < 0x100) * auVar15[6] - (0xff < sVar110);
            puVar12[0xc] = (0 < sVar112) * (sVar112 < 0x100) * auVar15[8] - (0xff < sVar112);
            puVar12[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar15[10] - (0xff < sVar114);
            puVar12[0xe] = (0 < sVar116) * (sVar116 < 0x100) * auVar15[0xc] - (0xff < sVar116);
            puVar12[0xf] = (0 < sVar118) * (sVar118 < 0x100) * auVar15[0xe] - (0xff < sVar118);
            lVar11 = lVar11 + 0x10;
          } while (lVar11 < w);
        }
        mask = mask + mask_stride;
        dst = dst + dst_stride;
        iVar9 = iVar9 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar6;
      } while (iVar9 != h);
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    if (w == 8) {
      if (0 < h) {
        auVar13 = pmovsxbw(in_XMM2,0x202020202020202);
        auVar15 = pmovsxbw(in_XMM3,0x4040404040404040);
        auVar22 = ZEXT416(uVar7);
        do {
          auVar85 = paddusb(*(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride),
                            *(undefined1 (*) [16])mask);
          auVar85 = pmaddubsw(auVar85,auVar14);
          uVar102 = (ushort)(auVar85._0_2_ + auVar13._0_2_) >> 2;
          uVar105 = (ushort)(auVar85._2_2_ + auVar13._2_2_) >> 2;
          uVar108 = (ushort)(auVar85._4_2_ + auVar13._4_2_) >> 2;
          uVar72 = (ushort)(auVar85._6_2_ + auVar13._6_2_) >> 2;
          uVar74 = (ushort)(auVar85._8_2_ + auVar13._8_2_) >> 2;
          uVar76 = (ushort)(auVar85._10_2_ + auVar13._10_2_) >> 2;
          uVar78 = (ushort)(auVar85._12_2_ + auVar13._12_2_) >> 2;
          uVar80 = (ushort)(auVar85._14_2_ + auVar13._14_2_) >> 2;
          auVar85 = *(undefined1 (*) [16])src0;
          auVar163._0_12_ = auVar85._0_12_;
          auVar163._12_2_ = auVar85._6_2_;
          auVar163._14_2_ = src1[3];
          auVar162._12_4_ = auVar163._12_4_;
          auVar162._0_10_ = auVar85._0_10_;
          auVar162._10_2_ = src1[2];
          auVar161._10_6_ = auVar162._10_6_;
          auVar161._0_8_ = auVar85._0_8_;
          auVar161._8_2_ = auVar85._4_2_;
          auVar160._8_8_ = auVar161._8_8_;
          auVar160._6_2_ = src1[1];
          auVar160._4_2_ = auVar85._2_2_;
          auVar160._0_2_ = auVar85._0_2_;
          auVar160._2_2_ = *src1;
          auVar189._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar15._6_2_ - uVar72,uVar72),auVar15._4_2_ - uVar108),
                         CONCAT22(uVar108,uVar72)) >> 0x10);
          auVar189._6_2_ = auVar15._2_2_ - uVar105;
          auVar189._4_2_ = uVar105;
          auVar189._2_2_ = auVar15._0_2_ - uVar102;
          auVar189._0_2_ = uVar102;
          auVar94 = pmaddwd(auVar189,auVar160);
          auVar93._2_2_ = src1[4];
          auVar93._0_2_ = auVar85._8_2_;
          auVar93._4_2_ = auVar85._10_2_;
          auVar93._6_2_ = src1[5];
          auVar93._8_2_ = auVar85._12_2_;
          auVar93._10_2_ = src1[6];
          auVar93._12_2_ = auVar85._14_2_;
          auVar93._14_2_ = src1[7];
          auVar53._2_2_ = auVar15._8_2_ - uVar74;
          auVar53._0_2_ = uVar74;
          auVar53._4_2_ = uVar76;
          auVar53._6_2_ = auVar15._10_2_ - uVar76;
          auVar53._8_2_ = uVar78;
          auVar53._10_2_ = auVar15._12_2_ - uVar78;
          auVar53._12_2_ = uVar80;
          auVar53._14_2_ = auVar15._14_2_ - uVar80;
          auVar190._0_4_ = auVar94._0_4_ + iVar10 * -0x40 >> auVar22;
          auVar190._4_4_ = auVar94._4_4_ + iVar10 * -0x40 >> auVar22;
          auVar190._8_4_ = auVar94._8_4_ + iVar10 * -0x40 >> auVar22;
          auVar190._12_4_ = auVar94._12_4_ + iVar10 * -0x40 >> auVar22;
          auVar85 = pmaddwd(auVar53,auVar93);
          auVar54._0_4_ = auVar85._0_4_ + iVar10 * -0x40 >> auVar22;
          auVar54._4_4_ = auVar85._4_4_ + iVar10 * -0x40 >> auVar22;
          auVar54._8_4_ = auVar85._8_4_ + iVar10 * -0x40 >> auVar22;
          auVar54._12_4_ = auVar85._12_4_ + iVar10 * -0x40 >> auVar22;
          auVar85 = packssdw(auVar190,auVar54);
          sVar69 = auVar85._0_2_;
          sVar70 = auVar85._2_2_;
          sVar71 = auVar85._4_2_;
          sVar73 = auVar85._6_2_;
          sVar75 = auVar85._8_2_;
          sVar77 = auVar85._10_2_;
          sVar79 = auVar85._12_2_;
          sVar81 = auVar85._14_2_;
          *(ulong *)dst =
               CONCAT17((0 < sVar81) * (sVar81 < 0x100) * auVar85[0xe] - (0xff < sVar81),
                        CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar85[0xc] - (0xff < sVar79),
                                 CONCAT15((0 < sVar77) * (sVar77 < 0x100) * auVar85[10] -
                                          (0xff < sVar77),
                                          CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar85[8] -
                                                   (0xff < sVar75),
                                                   CONCAT13((0 < sVar73) * (sVar73 < 0x100) *
                                                            auVar85[6] - (0xff < sVar73),
                                                            CONCAT12((0 < sVar71) * (sVar71 < 0x100)
                                                                     * auVar85[4] - (0xff < sVar71),
                                                                     CONCAT11((0 < sVar70) *
                                                                              (sVar70 < 0x100) *
                                                                              auVar85[2] -
                                                                              (0xff < sVar70),
                                                                              (0 < sVar69) *
                                                                              (sVar69 < 0x100) *
                                                                              auVar85[0] -
                                                                              (0xff < sVar69))))))))
          ;
          mask = *(undefined1 (*) [16])mask + mask_stride * 2;
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar6 * 2);
          src1 = src1 + src1_stride;
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      if (0 < h) {
        auVar13 = pmovsxbw(in_XMM2,0x202020202020202);
        auVar15 = pmovsxbw(in_XMM3,0x4040404040404040);
        auVar22 = ZEXT416(uVar7);
        do {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)mask;
          auVar84._8_8_ = 0;
          auVar84._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
          auVar85 = paddusb(auVar84,auVar38);
          auVar85 = pmaddubsw(auVar85,auVar14);
          auVar86._0_2_ = (ushort)(auVar85._0_2_ + auVar13._0_2_) >> 2;
          uVar102 = (ushort)(auVar85._2_2_ + auVar13._2_2_) >> 2;
          uVar105 = (ushort)(auVar85._4_2_ + auVar13._4_2_) >> 2;
          uVar108 = (ushort)(auVar85._6_2_ + auVar13._6_2_) >> 2;
          uVar4 = *(ulong *)src0;
          uVar5 = *(undefined8 *)src1;
          auVar122._8_4_ = 0;
          auVar122._0_8_ = uVar4;
          auVar122._12_2_ = (short)(uVar4 >> 0x30);
          auVar122._14_2_ = (short)((ulong)uVar5 >> 0x30);
          auVar121._12_4_ = auVar122._12_4_;
          auVar121._8_2_ = 0;
          auVar121._0_8_ = uVar4;
          auVar121._10_2_ = (short)((ulong)uVar5 >> 0x20);
          auVar120._10_6_ = auVar121._10_6_;
          auVar120._8_2_ = (short)(uVar4 >> 0x20);
          auVar120._0_8_ = uVar4;
          auVar119._8_8_ = auVar120._8_8_;
          auVar119._6_2_ = (short)((ulong)uVar5 >> 0x10);
          auVar119._4_2_ = (short)(uVar4 >> 0x10);
          auVar119._0_2_ = (undefined2)uVar4;
          auVar119._2_2_ = (short)uVar5;
          auVar86._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar15._6_2_ - uVar108,uVar108),auVar15._4_2_ - uVar105)
                         ,CONCAT22(uVar105,uVar108)) >> 0x10);
          auVar86._6_2_ = auVar15._2_2_ - uVar102;
          auVar86._4_2_ = uVar102;
          auVar86._2_2_ = auVar15._0_2_ - auVar86._0_2_;
          auVar85 = pmaddwd(auVar86,auVar119);
          auVar87._0_4_ = auVar85._0_4_ + iVar10 * -0x40 >> auVar22;
          auVar87._4_4_ = auVar85._4_4_ + iVar10 * -0x40 >> auVar22;
          auVar87._8_4_ = auVar85._8_4_ + iVar10 * -0x40 >> auVar22;
          auVar87._12_4_ = auVar85._12_4_ + iVar10 * -0x40 >> auVar22;
          auVar85 = packssdw(auVar87,auVar87);
          sVar69 = auVar85._0_2_;
          sVar70 = auVar85._2_2_;
          sVar71 = auVar85._4_2_;
          sVar73 = auVar85._6_2_;
          *(uint *)dst = CONCAT13((0 < sVar73) * (sVar73 < 0x100) * auVar85[6] - (0xff < sVar73),
                                  CONCAT12((0 < sVar71) * (sVar71 < 0x100) * auVar85[4] -
                                           (0xff < sVar71),
                                           CONCAT11((0 < sVar70) * (sVar70 < 0x100) * auVar85[2] -
                                                    (0xff < sVar70),
                                                    (0 < sVar69) * (sVar69 < 0x100) * auVar85[0] -
                                                    (0xff < sVar69))));
          mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)((long)src0 + uVar6 * 2);
          src1 = src1 + src1_stride;
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (0 < h) {
      puVar12 = mask + (ulong)mask_stride + 0x10;
      iVar9 = 0;
      auVar13 = pmovsxbw(in_XMM2,0x202020202020202);
      auVar15 = pmovsxbw(in_XMM3,0x4040404040404040);
      auVar22 = ZEXT416(uVar7);
      do {
        if (0 < w) {
          lVar11 = 0;
          do {
            auVar94 = paddusb(*(undefined1 (*) [16])(puVar12 + lVar11 * 2 + -0x10),
                              *(undefined1 (*) [16])(mask + lVar11 * 2));
            auVar85 = paddusb(*(undefined1 (*) [16])(puVar12 + lVar11 * 2),
                              *(undefined1 (*) [16])(mask + lVar11 * 2 + 0x10));
            auVar94 = pmaddubsw(auVar94,auVar14);
            auVar85 = pmaddubsw(auVar85,auVar14);
            uVar82 = (ushort)(auVar94._0_2_ + auVar13._0_2_) >> 2;
            uVar103 = (ushort)(auVar94._2_2_ + auVar13._2_2_) >> 2;
            uVar106 = (ushort)(auVar94._4_2_ + auVar13._4_2_) >> 2;
            uVar109 = (ushort)(auVar94._6_2_ + auVar13._6_2_) >> 2;
            uVar111 = (ushort)(auVar94._8_2_ + auVar13._8_2_) >> 2;
            uVar113 = (ushort)(auVar94._10_2_ + auVar13._10_2_) >> 2;
            uVar115 = (ushort)(auVar94._12_2_ + auVar13._12_2_) >> 2;
            uVar117 = (ushort)(auVar94._14_2_ + auVar13._14_2_) >> 2;
            uVar102 = (ushort)(auVar85._0_2_ + auVar13._0_2_) >> 2;
            uVar105 = (ushort)(auVar85._2_2_ + auVar13._2_2_) >> 2;
            uVar108 = (ushort)(auVar85._4_2_ + auVar13._4_2_) >> 2;
            uVar72 = (ushort)(auVar85._6_2_ + auVar13._6_2_) >> 2;
            uVar74 = (ushort)(auVar85._8_2_ + auVar13._8_2_) >> 2;
            uVar76 = (ushort)(auVar85._10_2_ + auVar13._10_2_) >> 2;
            uVar78 = (ushort)(auVar85._12_2_ + auVar13._12_2_) >> 2;
            uVar80 = (ushort)(auVar85._14_2_ + auVar13._14_2_) >> 2;
            auVar85 = *(undefined1 (*) [16])(src0 + lVar11);
            auVar94 = *(undefined1 (*) [16])(src0 + lVar11 + 8);
            pCVar1 = src1 + lVar11;
            pCVar3 = src1 + lVar11 + 8;
            auVar209._0_12_ = auVar85._0_12_;
            auVar209._12_2_ = auVar85._6_2_;
            auVar209._14_2_ = pCVar1[3];
            auVar208._12_4_ = auVar209._12_4_;
            auVar208._0_10_ = auVar85._0_10_;
            auVar208._10_2_ = pCVar1[2];
            auVar207._10_6_ = auVar208._10_6_;
            auVar207._0_8_ = auVar85._0_8_;
            auVar207._8_2_ = auVar85._4_2_;
            auVar206._8_8_ = auVar207._8_8_;
            auVar206._6_2_ = pCVar1[1];
            auVar206._4_2_ = auVar85._2_2_;
            auVar206._0_2_ = auVar85._0_2_;
            auVar206._2_2_ = *pCVar1;
            auVar128._8_8_ =
                 (undefined8)
                 (CONCAT64(CONCAT42(CONCAT22(auVar15._6_2_ - uVar109,uVar109),
                                    auVar15._4_2_ - uVar106),CONCAT22(uVar106,uVar109)) >> 0x10);
            auVar128._6_2_ = auVar15._2_2_ - uVar103;
            auVar128._4_2_ = uVar103;
            auVar128._2_2_ = auVar15._0_2_ - uVar82;
            auVar128._0_2_ = uVar82;
            auVar129 = pmaddwd(auVar128,auVar206);
            auVar164._2_2_ = pCVar1[4];
            auVar164._0_2_ = auVar85._8_2_;
            auVar164._4_2_ = auVar85._10_2_;
            auVar164._6_2_ = pCVar1[5];
            auVar164._8_2_ = auVar85._12_2_;
            auVar164._10_2_ = pCVar1[6];
            auVar164._12_2_ = auVar85._14_2_;
            auVar164._14_2_ = pCVar1[7];
            auVar95._2_2_ = auVar15._8_2_ - uVar111;
            auVar95._0_2_ = uVar111;
            auVar95._4_2_ = uVar113;
            auVar95._6_2_ = auVar15._10_2_ - uVar113;
            auVar95._8_2_ = uVar115;
            auVar95._10_2_ = auVar15._12_2_ - uVar115;
            auVar95._12_2_ = uVar117;
            auVar95._14_2_ = auVar15._14_2_ - uVar117;
            auVar96 = pmaddwd(auVar95,auVar164);
            auVar168._0_12_ = auVar94._0_12_;
            auVar168._12_2_ = auVar94._6_2_;
            auVar168._14_2_ = pCVar3[3];
            auVar167._12_4_ = auVar168._12_4_;
            auVar167._0_10_ = auVar94._0_10_;
            auVar167._10_2_ = pCVar3[2];
            auVar166._10_6_ = auVar167._10_6_;
            auVar166._0_8_ = auVar94._0_8_;
            auVar166._8_2_ = auVar94._4_2_;
            auVar165._8_8_ = auVar166._8_8_;
            auVar165._6_2_ = pCVar3[1];
            auVar165._4_2_ = auVar94._2_2_;
            auVar165._0_2_ = auVar94._0_2_;
            auVar165._2_2_ = *pCVar3;
            auVar191._8_8_ =
                 (undefined8)
                 (CONCAT64(CONCAT42(CONCAT22(auVar15._6_2_ - uVar72,uVar72),auVar15._4_2_ - uVar108)
                           ,CONCAT22(uVar108,uVar72)) >> 0x10);
            auVar191._6_2_ = auVar15._2_2_ - uVar105;
            auVar191._4_2_ = uVar105;
            auVar191._2_2_ = auVar15._0_2_ - uVar102;
            auVar191._0_2_ = uVar102;
            auVar192 = pmaddwd(auVar191,auVar165);
            auVar143._2_2_ = pCVar3[4];
            auVar143._0_2_ = auVar94._8_2_;
            auVar143._4_2_ = auVar94._10_2_;
            auVar143._6_2_ = pCVar3[5];
            auVar143._8_2_ = auVar94._12_2_;
            auVar143._10_2_ = pCVar3[6];
            auVar143._12_2_ = auVar94._14_2_;
            auVar143._14_2_ = pCVar3[7];
            auVar55._2_2_ = auVar15._8_2_ - uVar74;
            auVar55._0_2_ = uVar74;
            auVar55._4_2_ = uVar76;
            auVar55._6_2_ = auVar15._10_2_ - uVar76;
            auVar55._8_2_ = uVar78;
            auVar55._10_2_ = auVar15._12_2_ - uVar78;
            auVar55._12_2_ = uVar80;
            auVar55._14_2_ = auVar15._14_2_ - uVar80;
            auVar130._0_4_ = auVar129._0_4_ + iVar10 * -0x40 >> auVar22;
            auVar130._4_4_ = auVar129._4_4_ + iVar10 * -0x40 >> auVar22;
            auVar130._8_4_ = auVar129._8_4_ + iVar10 * -0x40 >> auVar22;
            auVar130._12_4_ = auVar129._12_4_ + iVar10 * -0x40 >> auVar22;
            auVar85 = pmaddwd(auVar55,auVar143);
            auVar97._0_4_ = auVar96._0_4_ + iVar10 * -0x40 >> auVar22;
            auVar97._4_4_ = auVar96._4_4_ + iVar10 * -0x40 >> auVar22;
            auVar97._8_4_ = auVar96._8_4_ + iVar10 * -0x40 >> auVar22;
            auVar97._12_4_ = auVar96._12_4_ + iVar10 * -0x40 >> auVar22;
            auVar94 = packssdw(auVar130,auVar97);
            auVar193._0_4_ = auVar192._0_4_ + iVar10 * -0x40 >> auVar22;
            auVar193._4_4_ = auVar192._4_4_ + iVar10 * -0x40 >> auVar22;
            auVar193._8_4_ = auVar192._8_4_ + iVar10 * -0x40 >> auVar22;
            auVar193._12_4_ = auVar192._12_4_ + iVar10 * -0x40 >> auVar22;
            auVar56._0_4_ = auVar85._0_4_ + iVar10 * -0x40 >> auVar22;
            auVar56._4_4_ = auVar85._4_4_ + iVar10 * -0x40 >> auVar22;
            auVar56._8_4_ = auVar85._8_4_ + iVar10 * -0x40 >> auVar22;
            auVar56._12_4_ = auVar85._12_4_ + iVar10 * -0x40 >> auVar22;
            auVar85 = packssdw(auVar193,auVar56);
            sVar69 = auVar94._0_2_;
            sVar70 = auVar94._2_2_;
            sVar71 = auVar94._4_2_;
            sVar73 = auVar94._6_2_;
            sVar75 = auVar94._8_2_;
            sVar77 = auVar94._10_2_;
            sVar79 = auVar94._12_2_;
            sVar81 = auVar94._14_2_;
            sVar83 = auVar85._0_2_;
            sVar104 = auVar85._2_2_;
            sVar107 = auVar85._4_2_;
            sVar110 = auVar85._6_2_;
            sVar112 = auVar85._8_2_;
            sVar114 = auVar85._10_2_;
            sVar116 = auVar85._12_2_;
            sVar118 = auVar85._14_2_;
            puVar2 = dst + lVar11;
            *puVar2 = (0 < sVar69) * (sVar69 < 0x100) * auVar94[0] - (0xff < sVar69);
            puVar2[1] = (0 < sVar70) * (sVar70 < 0x100) * auVar94[2] - (0xff < sVar70);
            puVar2[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar94[4] - (0xff < sVar71);
            puVar2[3] = (0 < sVar73) * (sVar73 < 0x100) * auVar94[6] - (0xff < sVar73);
            puVar2[4] = (0 < sVar75) * (sVar75 < 0x100) * auVar94[8] - (0xff < sVar75);
            puVar2[5] = (0 < sVar77) * (sVar77 < 0x100) * auVar94[10] - (0xff < sVar77);
            puVar2[6] = (0 < sVar79) * (sVar79 < 0x100) * auVar94[0xc] - (0xff < sVar79);
            puVar2[7] = (0 < sVar81) * (sVar81 < 0x100) * auVar94[0xe] - (0xff < sVar81);
            puVar2[8] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[0] - (0xff < sVar83);
            puVar2[9] = (0 < sVar104) * (sVar104 < 0x100) * auVar85[2] - (0xff < sVar104);
            puVar2[10] = (0 < sVar107) * (sVar107 < 0x100) * auVar85[4] - (0xff < sVar107);
            puVar2[0xb] = (0 < sVar110) * (sVar110 < 0x100) * auVar85[6] - (0xff < sVar110);
            puVar2[0xc] = (0 < sVar112) * (sVar112 < 0x100) * auVar85[8] - (0xff < sVar112);
            puVar2[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar85[10] - (0xff < sVar114);
            puVar2[0xe] = (0 < sVar116) * (sVar116 < 0x100) * auVar85[0xc] - (0xff < sVar116);
            puVar2[0xf] = (0 < sVar118) * (sVar118 < 0x100) * auVar85[0xe] - (0xff < sVar118);
            lVar11 = lVar11 + 0x10;
          } while (lVar11 < w);
        }
        mask = mask + mask_stride * 2;
        dst = dst + dst_stride;
        iVar9 = iVar9 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar6;
        puVar12 = puVar12 + mask_stride * 2;
      } while (iVar9 != h);
    }
  }
  else if ((subw ^ 1U) == 0 && subh == 0) {
    if (w == 8) {
      if (0 < h) {
        auVar13 = pmovsxbw(in_XMM3,0x4040404040404040);
        auVar15 = ZEXT416(uVar7);
        do {
          auVar22 = pmaddubsw(*(undefined1 (*) [16])mask,auVar14);
          sVar69 = pavgw(auVar22._0_2_,0);
          sVar70 = pavgw(auVar22._2_2_,0);
          sVar71 = pavgw(auVar22._4_2_,0);
          sVar73 = pavgw(auVar22._6_2_,0);
          sVar75 = pavgw(auVar22._8_2_,0);
          sVar77 = pavgw(auVar22._10_2_,0);
          sVar79 = pavgw(auVar22._12_2_,0);
          sVar81 = pavgw(auVar22._14_2_,0);
          auVar22 = *(undefined1 (*) [16])src0;
          auVar172._0_12_ = auVar22._0_12_;
          auVar172._12_2_ = auVar22._6_2_;
          auVar172._14_2_ = src1[3];
          auVar171._12_4_ = auVar172._12_4_;
          auVar171._0_10_ = auVar22._0_10_;
          auVar171._10_2_ = src1[2];
          auVar170._10_6_ = auVar171._10_6_;
          auVar170._0_8_ = auVar22._0_8_;
          auVar170._8_2_ = auVar22._4_2_;
          auVar169._8_8_ = auVar170._8_8_;
          auVar169._6_2_ = src1[1];
          auVar169._4_2_ = auVar22._2_2_;
          auVar169._0_2_ = auVar22._0_2_;
          auVar169._2_2_ = *src1;
          auVar194._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar13._6_2_ - sVar73,sVar73),auVar13._4_2_ - sVar71),
                         CONCAT22(sVar71,sVar73)) >> 0x10);
          auVar194._6_2_ = auVar13._2_2_ - sVar70;
          auVar194._4_2_ = sVar70;
          auVar194._2_2_ = auVar13._0_2_ - sVar69;
          auVar194._0_2_ = sVar69;
          auVar85 = pmaddwd(auVar194,auVar169);
          auVar98._2_2_ = src1[4];
          auVar98._0_2_ = auVar22._8_2_;
          auVar98._4_2_ = auVar22._10_2_;
          auVar98._6_2_ = src1[5];
          auVar98._8_2_ = auVar22._12_2_;
          auVar98._10_2_ = src1[6];
          auVar98._12_2_ = auVar22._14_2_;
          auVar98._14_2_ = src1[7];
          auVar57._2_2_ = auVar13._8_2_ - sVar75;
          auVar57._0_2_ = sVar75;
          auVar57._4_2_ = sVar77;
          auVar57._6_2_ = auVar13._10_2_ - sVar77;
          auVar57._8_2_ = sVar79;
          auVar57._10_2_ = auVar13._12_2_ - sVar79;
          auVar57._12_2_ = sVar81;
          auVar57._14_2_ = auVar13._14_2_ - sVar81;
          auVar195._0_4_ = auVar85._0_4_ + iVar10 * -0x40 >> auVar15;
          auVar195._4_4_ = auVar85._4_4_ + iVar10 * -0x40 >> auVar15;
          auVar195._8_4_ = auVar85._8_4_ + iVar10 * -0x40 >> auVar15;
          auVar195._12_4_ = auVar85._12_4_ + iVar10 * -0x40 >> auVar15;
          auVar22 = pmaddwd(auVar57,auVar98);
          auVar58._0_4_ = auVar22._0_4_ + iVar10 * -0x40 >> auVar15;
          auVar58._4_4_ = auVar22._4_4_ + iVar10 * -0x40 >> auVar15;
          auVar58._8_4_ = auVar22._8_4_ + iVar10 * -0x40 >> auVar15;
          auVar58._12_4_ = auVar22._12_4_ + iVar10 * -0x40 >> auVar15;
          auVar22 = packssdw(auVar195,auVar58);
          sVar69 = auVar22._0_2_;
          sVar70 = auVar22._2_2_;
          sVar71 = auVar22._4_2_;
          sVar73 = auVar22._6_2_;
          sVar75 = auVar22._8_2_;
          sVar77 = auVar22._10_2_;
          sVar79 = auVar22._12_2_;
          sVar81 = auVar22._14_2_;
          *(ulong *)dst =
               CONCAT17((0 < sVar81) * (sVar81 < 0x100) * auVar22[0xe] - (0xff < sVar81),
                        CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar22[0xc] - (0xff < sVar79),
                                 CONCAT15((0 < sVar77) * (sVar77 < 0x100) * auVar22[10] -
                                          (0xff < sVar77),
                                          CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar22[8] -
                                                   (0xff < sVar75),
                                                   CONCAT13((0 < sVar73) * (sVar73 < 0x100) *
                                                            auVar22[6] - (0xff < sVar73),
                                                            CONCAT12((0 < sVar71) * (sVar71 < 0x100)
                                                                     * auVar22[4] - (0xff < sVar71),
                                                                     CONCAT11((0 < sVar70) *
                                                                              (sVar70 < 0x100) *
                                                                              auVar22[2] -
                                                                              (0xff < sVar70),
                                                                              (0 < sVar69) *
                                                                              (sVar69 < 0x100) *
                                                                              auVar22[0] -
                                                                              (0xff < sVar69))))))))
          ;
          mask = *(undefined1 (*) [16])mask + mask_stride;
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar6 * 2);
          src1 = src1 + src1_stride;
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      if (0 < h) {
        auVar13 = pmovsxbw(in_XMM3,0x4040404040404040);
        auVar15 = ZEXT416(uVar7);
        do {
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)mask;
          auVar22 = pmaddubsw(auVar43,auVar14);
          auVar44._0_2_ = pavgw(auVar22._0_2_,0);
          sVar69 = pavgw(auVar22._2_2_,0);
          sVar70 = pavgw(auVar22._4_2_,0);
          sVar71 = pavgw(auVar22._6_2_,0);
          pavgw(auVar22._8_2_,0);
          pavgw(auVar22._10_2_,0);
          pavgw(auVar22._12_2_,0);
          pavgw(auVar22._14_2_,0);
          uVar4 = *(ulong *)src0;
          uVar5 = *(undefined8 *)src1;
          auVar126._8_4_ = 0;
          auVar126._0_8_ = uVar4;
          auVar126._12_2_ = (short)(uVar4 >> 0x30);
          auVar126._14_2_ = (short)((ulong)uVar5 >> 0x30);
          auVar125._12_4_ = auVar126._12_4_;
          auVar125._8_2_ = 0;
          auVar125._0_8_ = uVar4;
          auVar125._10_2_ = (short)((ulong)uVar5 >> 0x20);
          auVar124._10_6_ = auVar125._10_6_;
          auVar124._8_2_ = (short)(uVar4 >> 0x20);
          auVar124._0_8_ = uVar4;
          auVar123._8_8_ = auVar124._8_8_;
          auVar123._6_2_ = (short)((ulong)uVar5 >> 0x10);
          auVar123._4_2_ = (short)(uVar4 >> 0x10);
          auVar123._0_2_ = (undefined2)uVar4;
          auVar123._2_2_ = (short)uVar5;
          auVar44._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar13._6_2_ - sVar71,sVar71),auVar13._4_2_ - sVar70),
                         CONCAT22(sVar70,sVar71)) >> 0x10);
          auVar44._6_2_ = auVar13._2_2_ - sVar69;
          auVar44._4_2_ = sVar69;
          auVar44._2_2_ = auVar13._0_2_ - auVar44._0_2_;
          auVar22 = pmaddwd(auVar44,auVar123);
          auVar45._0_4_ = auVar22._0_4_ + iVar10 * -0x40 >> auVar15;
          auVar45._4_4_ = auVar22._4_4_ + iVar10 * -0x40 >> auVar15;
          auVar45._8_4_ = auVar22._8_4_ + iVar10 * -0x40 >> auVar15;
          auVar45._12_4_ = auVar22._12_4_ + iVar10 * -0x40 >> auVar15;
          auVar22 = packssdw(auVar45,auVar45);
          sVar69 = auVar22._0_2_;
          sVar70 = auVar22._2_2_;
          sVar71 = auVar22._4_2_;
          sVar73 = auVar22._6_2_;
          *(uint *)dst = CONCAT13((0 < sVar73) * (sVar73 < 0x100) * auVar22[6] - (0xff < sVar73),
                                  CONCAT12((0 < sVar71) * (sVar71 < 0x100) * auVar22[4] -
                                           (0xff < sVar71),
                                           CONCAT11((0 < sVar70) * (sVar70 < 0x100) * auVar22[2] -
                                                    (0xff < sVar70),
                                                    (0 < sVar69) * (sVar69 < 0x100) * auVar22[0] -
                                                    (0xff < sVar69))));
          mask = (uint8_t *)((long)mask + (ulong)mask_stride);
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)((long)src0 + uVar6 * 2);
          src1 = src1 + src1_stride;
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (0 < h) {
      iVar9 = 0;
      auVar13 = pmovsxbw(in_XMM3,0x4040404040404040);
      auVar15 = ZEXT416(uVar7);
      do {
        if (0 < w) {
          lVar11 = 0;
          do {
            auVar85 = pmaddubsw(*(undefined1 (*) [16])(mask + lVar11 * 2),auVar14);
            auVar22 = pmaddubsw(*(undefined1 (*) [16])(mask + lVar11 * 2 + 0x10),auVar14);
            sVar83 = pavgw(auVar85._0_2_,0);
            sVar104 = pavgw(auVar85._2_2_,0);
            sVar107 = pavgw(auVar85._4_2_,0);
            sVar110 = pavgw(auVar85._6_2_,0);
            sVar112 = pavgw(auVar85._8_2_,0);
            sVar114 = pavgw(auVar85._10_2_,0);
            sVar116 = pavgw(auVar85._12_2_,0);
            sVar118 = pavgw(auVar85._14_2_,0);
            sVar69 = pavgw(auVar22._0_2_,0);
            sVar70 = pavgw(auVar22._2_2_,0);
            sVar71 = pavgw(auVar22._4_2_,0);
            sVar73 = pavgw(auVar22._6_2_,0);
            sVar75 = pavgw(auVar22._8_2_,0);
            sVar77 = pavgw(auVar22._10_2_,0);
            sVar79 = pavgw(auVar22._12_2_,0);
            sVar81 = pavgw(auVar22._14_2_,0);
            auVar22 = *(undefined1 (*) [16])(src0 + lVar11);
            auVar85 = *(undefined1 (*) [16])(src0 + lVar11 + 8);
            pCVar1 = src1 + lVar11;
            pCVar3 = src1 + lVar11 + 8;
            auVar213._0_12_ = auVar22._0_12_;
            auVar213._12_2_ = auVar22._6_2_;
            auVar213._14_2_ = pCVar1[3];
            auVar212._12_4_ = auVar213._12_4_;
            auVar212._0_10_ = auVar22._0_10_;
            auVar212._10_2_ = pCVar1[2];
            auVar211._10_6_ = auVar212._10_6_;
            auVar211._0_8_ = auVar22._0_8_;
            auVar211._8_2_ = auVar22._4_2_;
            auVar210._8_8_ = auVar211._8_8_;
            auVar210._6_2_ = pCVar1[1];
            auVar210._4_2_ = auVar22._2_2_;
            auVar210._0_2_ = auVar22._0_2_;
            auVar210._2_2_ = *pCVar1;
            auVar131._8_8_ =
                 (undefined8)
                 (CONCAT64(CONCAT42(CONCAT22(auVar13._6_2_ - sVar110,sVar110),
                                    auVar13._4_2_ - sVar107),CONCAT22(sVar107,sVar110)) >> 0x10);
            auVar131._6_2_ = auVar13._2_2_ - sVar104;
            auVar131._4_2_ = sVar104;
            auVar131._2_2_ = auVar13._0_2_ - sVar83;
            auVar131._0_2_ = sVar83;
            auVar96 = pmaddwd(auVar131,auVar210);
            auVar178._2_2_ = pCVar1[4];
            auVar178._0_2_ = auVar22._8_2_;
            auVar178._4_2_ = auVar22._10_2_;
            auVar178._6_2_ = pCVar1[5];
            auVar178._8_2_ = auVar22._12_2_;
            auVar178._10_2_ = pCVar1[6];
            auVar178._12_2_ = auVar22._14_2_;
            auVar178._14_2_ = pCVar1[7];
            auVar99._2_2_ = auVar13._8_2_ - sVar112;
            auVar99._0_2_ = sVar112;
            auVar99._4_2_ = sVar114;
            auVar99._6_2_ = auVar13._10_2_ - sVar114;
            auVar99._8_2_ = sVar116;
            auVar99._10_2_ = auVar13._12_2_ - sVar116;
            auVar99._12_2_ = sVar118;
            auVar99._14_2_ = auVar13._14_2_ - sVar118;
            auVar94 = pmaddwd(auVar99,auVar178);
            auVar182._0_12_ = auVar85._0_12_;
            auVar182._12_2_ = auVar85._6_2_;
            auVar182._14_2_ = pCVar3[3];
            auVar181._12_4_ = auVar182._12_4_;
            auVar181._0_10_ = auVar85._0_10_;
            auVar181._10_2_ = pCVar3[2];
            auVar180._10_6_ = auVar181._10_6_;
            auVar180._0_8_ = auVar85._0_8_;
            auVar180._8_2_ = auVar85._4_2_;
            auVar179._8_8_ = auVar180._8_8_;
            auVar179._6_2_ = pCVar3[1];
            auVar179._4_2_ = auVar85._2_2_;
            auVar179._0_2_ = auVar85._0_2_;
            auVar179._2_2_ = *pCVar3;
            auVar196._8_8_ =
                 (undefined8)
                 (CONCAT64(CONCAT42(CONCAT22(auVar13._6_2_ - sVar73,sVar73),auVar13._4_2_ - sVar71),
                           CONCAT22(sVar71,sVar73)) >> 0x10);
            auVar196._6_2_ = auVar13._2_2_ - sVar70;
            auVar196._4_2_ = sVar70;
            auVar196._2_2_ = auVar13._0_2_ - sVar69;
            auVar196._0_2_ = sVar69;
            auVar129 = pmaddwd(auVar196,auVar179);
            auVar148._2_2_ = pCVar3[4];
            auVar148._0_2_ = auVar85._8_2_;
            auVar148._4_2_ = auVar85._10_2_;
            auVar148._6_2_ = pCVar3[5];
            auVar148._8_2_ = auVar85._12_2_;
            auVar148._10_2_ = pCVar3[6];
            auVar148._12_2_ = auVar85._14_2_;
            auVar148._14_2_ = pCVar3[7];
            auVar62._2_2_ = auVar13._8_2_ - sVar75;
            auVar62._0_2_ = sVar75;
            auVar62._4_2_ = sVar77;
            auVar62._6_2_ = auVar13._10_2_ - sVar77;
            auVar62._8_2_ = sVar79;
            auVar62._10_2_ = auVar13._12_2_ - sVar79;
            auVar62._12_2_ = sVar81;
            auVar62._14_2_ = auVar13._14_2_ - sVar81;
            auVar132._0_4_ = auVar96._0_4_ + iVar10 * -0x40 >> auVar15;
            auVar132._4_4_ = auVar96._4_4_ + iVar10 * -0x40 >> auVar15;
            auVar132._8_4_ = auVar96._8_4_ + iVar10 * -0x40 >> auVar15;
            auVar132._12_4_ = auVar96._12_4_ + iVar10 * -0x40 >> auVar15;
            auVar22 = pmaddwd(auVar62,auVar148);
            auVar100._0_4_ = auVar94._0_4_ + iVar10 * -0x40 >> auVar15;
            auVar100._4_4_ = auVar94._4_4_ + iVar10 * -0x40 >> auVar15;
            auVar100._8_4_ = auVar94._8_4_ + iVar10 * -0x40 >> auVar15;
            auVar100._12_4_ = auVar94._12_4_ + iVar10 * -0x40 >> auVar15;
            auVar85 = packssdw(auVar132,auVar100);
            auVar197._0_4_ = auVar129._0_4_ + iVar10 * -0x40 >> auVar15;
            auVar197._4_4_ = auVar129._4_4_ + iVar10 * -0x40 >> auVar15;
            auVar197._8_4_ = auVar129._8_4_ + iVar10 * -0x40 >> auVar15;
            auVar197._12_4_ = auVar129._12_4_ + iVar10 * -0x40 >> auVar15;
            auVar63._0_4_ = auVar22._0_4_ + iVar10 * -0x40 >> auVar15;
            auVar63._4_4_ = auVar22._4_4_ + iVar10 * -0x40 >> auVar15;
            auVar63._8_4_ = auVar22._8_4_ + iVar10 * -0x40 >> auVar15;
            auVar63._12_4_ = auVar22._12_4_ + iVar10 * -0x40 >> auVar15;
            auVar22 = packssdw(auVar197,auVar63);
            sVar69 = auVar85._0_2_;
            sVar70 = auVar85._2_2_;
            sVar71 = auVar85._4_2_;
            sVar73 = auVar85._6_2_;
            sVar75 = auVar85._8_2_;
            sVar77 = auVar85._10_2_;
            sVar79 = auVar85._12_2_;
            sVar81 = auVar85._14_2_;
            sVar83 = auVar22._0_2_;
            sVar104 = auVar22._2_2_;
            sVar107 = auVar22._4_2_;
            sVar110 = auVar22._6_2_;
            sVar112 = auVar22._8_2_;
            sVar114 = auVar22._10_2_;
            sVar116 = auVar22._12_2_;
            sVar118 = auVar22._14_2_;
            puVar12 = dst + lVar11;
            *puVar12 = (0 < sVar69) * (sVar69 < 0x100) * auVar85[0] - (0xff < sVar69);
            puVar12[1] = (0 < sVar70) * (sVar70 < 0x100) * auVar85[2] - (0xff < sVar70);
            puVar12[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar85[4] - (0xff < sVar71);
            puVar12[3] = (0 < sVar73) * (sVar73 < 0x100) * auVar85[6] - (0xff < sVar73);
            puVar12[4] = (0 < sVar75) * (sVar75 < 0x100) * auVar85[8] - (0xff < sVar75);
            puVar12[5] = (0 < sVar77) * (sVar77 < 0x100) * auVar85[10] - (0xff < sVar77);
            puVar12[6] = (0 < sVar79) * (sVar79 < 0x100) * auVar85[0xc] - (0xff < sVar79);
            puVar12[7] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[0xe] - (0xff < sVar81);
            puVar12[8] = (0 < sVar83) * (sVar83 < 0x100) * auVar22[0] - (0xff < sVar83);
            puVar12[9] = (0 < sVar104) * (sVar104 < 0x100) * auVar22[2] - (0xff < sVar104);
            puVar12[10] = (0 < sVar107) * (sVar107 < 0x100) * auVar22[4] - (0xff < sVar107);
            puVar12[0xb] = (0 < sVar110) * (sVar110 < 0x100) * auVar22[6] - (0xff < sVar110);
            puVar12[0xc] = (0 < sVar112) * (sVar112 < 0x100) * auVar22[8] - (0xff < sVar112);
            puVar12[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar22[10] - (0xff < sVar114);
            puVar12[0xe] = (0 < sVar116) * (sVar116 < 0x100) * auVar22[0xc] - (0xff < sVar116);
            puVar12[0xf] = (0 < sVar118) * (sVar118 < 0x100) * auVar22[0xe] - (0xff < sVar118);
            lVar11 = lVar11 + 0x10;
          } while (lVar11 < w);
        }
        mask = mask + mask_stride;
        dst = dst + dst_stride;
        iVar9 = iVar9 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar6;
      } while (iVar9 != h);
    }
  }
  else if (w == 8) {
    if (0 < h) {
      auVar14 = pmovsxbw(in_XMM2,0x4040404040404040);
      auVar13 = ZEXT416(uVar7);
      do {
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)mask;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
        auVar15 = paddusb(auVar59,auVar31);
        auVar60[0] = pavgb(auVar15[0],0);
        auVar60[1] = pavgb(auVar15[1],0);
        auVar60[2] = pavgb(auVar15[2],0);
        auVar60[3] = pavgb(auVar15[3],0);
        auVar60[4] = pavgb(auVar15[4],0);
        auVar60[5] = pavgb(auVar15[5],0);
        auVar60[6] = pavgb(auVar15[6],0);
        auVar60[7] = pavgb(auVar15[7],0);
        auVar60[8] = pavgb(auVar15[8],0);
        auVar60[9] = pavgb(auVar15[9],0);
        auVar60[10] = pavgb(auVar15[10],0);
        auVar60[0xb] = pavgb(auVar15[0xb],0);
        auVar60[0xc] = pavgb(auVar15[0xc],0);
        auVar60[0xd] = pavgb(auVar15[0xd],0);
        auVar60[0xe] = pavgb(auVar15[0xe],0);
        auVar60[0xf] = pavgb(auVar15[0xf],0);
        auVar22 = pmovzxbw(auVar31,auVar60);
        auVar15 = *(undefined1 (*) [16])src0;
        auVar147._0_12_ = auVar15._0_12_;
        auVar147._12_2_ = auVar15._6_2_;
        auVar147._14_2_ = src1[3];
        auVar146._12_4_ = auVar147._12_4_;
        auVar146._0_10_ = auVar15._0_10_;
        auVar146._10_2_ = src1[2];
        auVar145._10_6_ = auVar146._10_6_;
        auVar145._0_8_ = auVar15._0_8_;
        auVar145._8_2_ = auVar15._4_2_;
        auVar144._8_8_ = auVar145._8_8_;
        auVar144._6_2_ = src1[1];
        auVar144._4_2_ = auVar15._2_2_;
        auVar144._0_2_ = auVar15._0_2_;
        auVar144._2_2_ = *src1;
        auVar176._0_12_ = auVar22._0_12_;
        auVar176._12_2_ = auVar22._6_2_;
        auVar176._14_2_ = auVar14._6_2_ - auVar22._6_2_;
        auVar175._12_4_ = auVar176._12_4_;
        auVar175._0_10_ = auVar22._0_10_;
        auVar175._10_2_ = auVar14._4_2_ - auVar22._4_2_;
        auVar174._10_6_ = auVar175._10_6_;
        auVar174._0_8_ = auVar22._0_8_;
        auVar174._8_2_ = auVar22._4_2_;
        auVar173._8_8_ = auVar174._8_8_;
        auVar173._6_2_ = auVar14._2_2_ - auVar22._2_2_;
        auVar173._4_2_ = auVar22._2_2_;
        auVar173._2_2_ = auVar14._0_2_ - auVar22._0_2_;
        auVar173._0_2_ = auVar22._0_2_;
        auVar85 = pmaddwd(auVar173,auVar144);
        auVar61._2_2_ = src1[4];
        auVar61._0_2_ = auVar15._8_2_;
        auVar61._4_2_ = auVar15._10_2_;
        auVar61._6_2_ = src1[5];
        auVar61._8_2_ = auVar15._12_2_;
        auVar61._10_2_ = src1[6];
        auVar61._12_2_ = auVar15._14_2_;
        auVar61._14_2_ = src1[7];
        auVar32._2_2_ = auVar14._8_2_ - auVar22._8_2_;
        auVar32._0_2_ = auVar22._8_2_;
        auVar32._4_2_ = auVar22._10_2_;
        auVar32._6_2_ = auVar14._10_2_ - auVar22._10_2_;
        auVar32._8_2_ = auVar22._12_2_;
        auVar32._10_2_ = auVar14._12_2_ - auVar22._12_2_;
        auVar32._12_2_ = auVar22._14_2_;
        auVar32._14_2_ = auVar14._14_2_ - auVar22._14_2_;
        auVar177._0_4_ = auVar85._0_4_ + iVar10 * -0x40 >> auVar13;
        auVar177._4_4_ = auVar85._4_4_ + iVar10 * -0x40 >> auVar13;
        auVar177._8_4_ = auVar85._8_4_ + iVar10 * -0x40 >> auVar13;
        auVar177._12_4_ = auVar85._12_4_ + iVar10 * -0x40 >> auVar13;
        auVar15 = pmaddwd(auVar32,auVar61);
        auVar33._0_4_ = auVar15._0_4_ + iVar10 * -0x40 >> auVar13;
        auVar33._4_4_ = auVar15._4_4_ + iVar10 * -0x40 >> auVar13;
        auVar33._8_4_ = auVar15._8_4_ + iVar10 * -0x40 >> auVar13;
        auVar33._12_4_ = auVar15._12_4_ + iVar10 * -0x40 >> auVar13;
        auVar15 = packssdw(auVar177,auVar33);
        sVar69 = auVar15._0_2_;
        sVar70 = auVar15._2_2_;
        sVar71 = auVar15._4_2_;
        sVar73 = auVar15._6_2_;
        sVar75 = auVar15._8_2_;
        sVar77 = auVar15._10_2_;
        sVar79 = auVar15._12_2_;
        sVar81 = auVar15._14_2_;
        *(ulong *)dst =
             CONCAT17((0 < sVar81) * (sVar81 < 0x100) * auVar15[0xe] - (0xff < sVar81),
                      CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar15[0xc] - (0xff < sVar79),
                               CONCAT15((0 < sVar77) * (sVar77 < 0x100) * auVar15[10] -
                                        (0xff < sVar77),
                                        CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar15[8] -
                                                 (0xff < sVar75),
                                                 CONCAT13((0 < sVar73) * (sVar73 < 0x100) *
                                                          auVar15[6] - (0xff < sVar73),
                                                          CONCAT12((0 < sVar71) * (sVar71 < 0x100) *
                                                                   auVar15[4] - (0xff < sVar71),
                                                                   CONCAT11((0 < sVar70) *
                                                                            (sVar70 < 0x100) *
                                                                            auVar15[2] -
                                                                            (0xff < sVar70),
                                                                            (0 < sVar69) *
                                                                            (sVar69 < 0x100) *
                                                                            auVar15[0] -
                                                                            (0xff < sVar69))))))));
        mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
        dst = dst + dst_stride;
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar6 * 2);
        src1 = src1 + src1_stride;
        h = h + -1;
      } while (h != 0);
    }
  }
  else if (w == 4) {
    if (0 < h) {
      auVar14 = pmovsxbw(in_XMM2,0x4040404040404040);
      auVar13 = ZEXT416(uVar7);
      do {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)mask;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
        auVar15 = paddusb(auVar46,auVar23);
        auVar47[0] = pavgb(auVar15[0],0);
        auVar47[1] = pavgb(auVar15[1],0);
        auVar47[2] = pavgb(auVar15[2],0);
        auVar47[3] = pavgb(auVar15[3],0);
        auVar47[4] = pavgb(auVar15[4],0);
        auVar47[5] = pavgb(auVar15[5],0);
        auVar47[6] = pavgb(auVar15[6],0);
        auVar47[7] = pavgb(auVar15[7],0);
        auVar47[8] = pavgb(auVar15[8],0);
        auVar47[9] = pavgb(auVar15[9],0);
        auVar47[10] = pavgb(auVar15[10],0);
        auVar47[0xb] = pavgb(auVar15[0xb],0);
        auVar47[0xc] = pavgb(auVar15[0xc],0);
        auVar47[0xd] = pavgb(auVar15[0xd],0);
        auVar47[0xe] = pavgb(auVar15[0xe],0);
        auVar47[0xf] = pavgb(auVar15[0xf],0);
        auVar15 = pmovzxbw(auVar23,auVar47);
        auVar24._0_2_ = auVar15._0_2_;
        uVar4 = *(ulong *)src0;
        uVar5 = *(undefined8 *)src1;
        auVar91._8_4_ = 0;
        auVar91._0_8_ = uVar4;
        auVar91._12_2_ = (short)(uVar4 >> 0x30);
        auVar91._14_2_ = (short)((ulong)uVar5 >> 0x30);
        auVar90._12_4_ = auVar91._12_4_;
        auVar90._8_2_ = 0;
        auVar90._0_8_ = uVar4;
        auVar90._10_2_ = (short)((ulong)uVar5 >> 0x20);
        auVar89._10_6_ = auVar90._10_6_;
        auVar89._8_2_ = (short)(uVar4 >> 0x20);
        auVar89._0_8_ = uVar4;
        auVar88._8_8_ = auVar89._8_8_;
        auVar88._6_2_ = (short)((ulong)uVar5 >> 0x10);
        auVar88._4_2_ = (short)(uVar4 >> 0x10);
        auVar88._0_2_ = (undefined2)uVar4;
        auVar88._2_2_ = (short)uVar5;
        auVar27._0_12_ = auVar15._0_12_;
        auVar27._12_2_ = auVar15._6_2_;
        auVar27._14_2_ = auVar14._6_2_ - auVar15._6_2_;
        auVar26._12_4_ = auVar27._12_4_;
        auVar26._0_10_ = auVar15._0_10_;
        auVar26._10_2_ = auVar14._4_2_ - auVar15._4_2_;
        auVar25._10_6_ = auVar26._10_6_;
        auVar25._0_8_ = auVar15._0_8_;
        auVar25._8_2_ = auVar15._4_2_;
        auVar24._8_8_ = auVar25._8_8_;
        auVar24._6_2_ = auVar14._2_2_ - auVar15._2_2_;
        auVar24._4_2_ = auVar15._2_2_;
        auVar24._2_2_ = auVar14._0_2_ - auVar24._0_2_;
        auVar15 = pmaddwd(auVar24,auVar88);
        auVar28._0_4_ = auVar15._0_4_ + iVar10 * -0x40 >> auVar13;
        auVar28._4_4_ = auVar15._4_4_ + iVar10 * -0x40 >> auVar13;
        auVar28._8_4_ = auVar15._8_4_ + iVar10 * -0x40 >> auVar13;
        auVar28._12_4_ = auVar15._12_4_ + iVar10 * -0x40 >> auVar13;
        auVar15 = packssdw(auVar28,auVar28);
        sVar69 = auVar15._0_2_;
        sVar70 = auVar15._2_2_;
        sVar71 = auVar15._4_2_;
        sVar73 = auVar15._6_2_;
        *(uint *)dst = CONCAT13((0 < sVar73) * (sVar73 < 0x100) * auVar15[6] - (0xff < sVar73),
                                CONCAT12((0 < sVar71) * (sVar71 < 0x100) * auVar15[4] -
                                         (0xff < sVar71),
                                         CONCAT11((0 < sVar70) * (sVar70 < 0x100) * auVar15[2] -
                                                  (0xff < sVar70),
                                                  (0 < sVar69) * (sVar69 < 0x100) * auVar15[0] -
                                                  (0xff < sVar69))));
        mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
        dst = dst + dst_stride;
        src0 = (CONV_BUF_TYPE *)((long)src0 + uVar6 * 2);
        src1 = src1 + src1_stride;
        h = h + -1;
      } while (h != 0);
    }
  }
  else if (0 < h) {
    puVar12 = mask + mask_stride;
    iVar9 = 0;
    auVar14 = pmovsxbw(in_XMM2,0x4040404040404040);
    auVar13 = ZEXT416(uVar7);
    do {
      if (0 < w) {
        lVar11 = 0;
        do {
          auVar15 = paddusb(*(undefined1 (*) [16])(puVar12 + lVar11),
                            *(undefined1 (*) [16])(mask + lVar11));
          auVar34[0] = pavgb(auVar15[0],0);
          auVar34[1] = pavgb(auVar15[1],0);
          auVar34[2] = pavgb(auVar15[2],0);
          auVar34[3] = pavgb(auVar15[3],0);
          auVar34[4] = pavgb(auVar15[4],0);
          auVar34[5] = pavgb(auVar15[5],0);
          auVar34[6] = pavgb(auVar15[6],0);
          auVar34[7] = pavgb(auVar15[7],0);
          auVar34[8] = pavgb(auVar15[8],0);
          auVar34[9] = pavgb(auVar15[9],0);
          auVar34[10] = pavgb(auVar15[10],0);
          auVar34[0xb] = pavgb(auVar15[0xb],0);
          auVar34[0xc] = pavgb(auVar15[0xc],0);
          auVar34[0xd] = pavgb(auVar15[0xd],0);
          auVar34[0xe] = pavgb(auVar15[0xe],0);
          auVar34[0xf] = pavgb(auVar15[0xf],0);
          auVar94 = pmovzxbw(in_XMM6,auVar34);
          auVar187[10] = auVar34[0xd];
          auVar187._0_10_ = (unkuint10)auVar34[0xc] << 0x40;
          auVar187[0xb] = 0;
          auVar15 = *(undefined1 (*) [16])(src0 + lVar11);
          auVar22 = *(undefined1 (*) [16])(src0 + lVar11 + 8);
          pCVar1 = src1 + lVar11;
          pCVar3 = src1 + lVar11 + 8;
          auVar205._0_12_ = auVar15._0_12_;
          auVar205._12_2_ = auVar15._6_2_;
          auVar205._14_2_ = pCVar1[3];
          auVar204._12_4_ = auVar205._12_4_;
          auVar204._0_10_ = auVar15._0_10_;
          auVar204._10_2_ = pCVar1[2];
          auVar203._10_6_ = auVar204._10_6_;
          auVar203._0_8_ = auVar15._0_8_;
          auVar203._8_2_ = auVar15._4_2_;
          auVar202._8_8_ = auVar203._8_8_;
          auVar202._6_2_ = pCVar1[1];
          auVar202._4_2_ = auVar15._2_2_;
          auVar202._0_2_ = auVar15._0_2_;
          auVar202._2_2_ = *pCVar1;
          auVar67._0_12_ = auVar94._0_12_;
          auVar67._12_2_ = auVar94._6_2_;
          auVar67._14_2_ = auVar14._6_2_ - auVar94._6_2_;
          auVar66._12_4_ = auVar67._12_4_;
          auVar66._0_10_ = auVar94._0_10_;
          auVar66._10_2_ = auVar14._4_2_ - auVar94._4_2_;
          auVar65._10_6_ = auVar66._10_6_;
          auVar65._0_8_ = auVar94._0_8_;
          auVar65._8_2_ = auVar94._4_2_;
          auVar64._8_8_ = auVar65._8_8_;
          auVar64._6_2_ = auVar14._2_2_ - auVar94._2_2_;
          auVar64._4_2_ = auVar94._2_2_;
          auVar64._2_2_ = auVar14._0_2_ - auVar94._0_2_;
          auVar64._0_2_ = auVar94._0_2_;
          auVar85 = pmaddwd(auVar64,auVar202);
          auVar149._2_2_ = pCVar1[4];
          auVar149._0_2_ = auVar15._8_2_;
          auVar149._4_2_ = auVar15._10_2_;
          auVar149._6_2_ = pCVar1[5];
          auVar149._8_2_ = auVar15._12_2_;
          auVar149._10_2_ = pCVar1[6];
          auVar149._12_2_ = auVar15._14_2_;
          auVar149._14_2_ = pCVar1[7];
          auVar101._2_2_ = auVar14._8_2_ - auVar94._8_2_;
          auVar101._0_2_ = auVar94._8_2_;
          auVar101._4_2_ = auVar94._10_2_;
          auVar101._6_2_ = auVar14._10_2_ - auVar94._10_2_;
          auVar101._8_2_ = auVar94._12_2_;
          auVar101._10_2_ = auVar14._12_2_ - auVar94._12_2_;
          auVar101._12_2_ = auVar94._14_2_;
          auVar101._14_2_ = auVar14._14_2_ - auVar94._14_2_;
          auVar94 = pmaddwd(auVar101,auVar149);
          auVar153._0_12_ = auVar22._0_12_;
          auVar153._12_2_ = auVar22._6_2_;
          auVar153._14_2_ = pCVar3[3];
          auVar152._12_4_ = auVar153._12_4_;
          auVar152._0_10_ = auVar22._0_10_;
          auVar152._10_2_ = pCVar3[2];
          auVar151._10_6_ = auVar152._10_6_;
          auVar151._0_8_ = auVar22._0_8_;
          auVar151._8_2_ = auVar22._4_2_;
          auVar150._8_8_ = auVar151._8_8_;
          auVar150._6_2_ = pCVar3[1];
          auVar150._4_2_ = auVar22._2_2_;
          auVar150._0_2_ = auVar22._0_2_;
          auVar150._2_2_ = *pCVar3;
          auVar187[0xc] = auVar34[0xb];
          auVar187[0xd] = 0;
          auVar187._14_2_ = auVar14._6_2_ - (ushort)auVar34[0xb];
          auVar186._12_4_ = auVar187._12_4_;
          auVar186._10_2_ = auVar14._4_2_ - (ushort)auVar34[10];
          auVar186._0_10_ = (unkuint10)auVar34[0xc] << 0x40;
          auVar185._10_6_ = auVar186._10_6_;
          auVar185._0_10_ = (unkuint10)auVar34[10] << 0x40;
          auVar184._8_8_ = auVar185._8_8_;
          auVar184._6_2_ = auVar14._2_2_ - (ushort)auVar34[9];
          auVar184._0_6_ = (uint6)auVar34[9] << 0x20;
          auVar183._4_12_ = auVar184._4_12_;
          auVar183._2_2_ = auVar14._0_2_ - CONCAT11(0,auVar34[8]);
          auVar183._0_2_ = CONCAT11(0,auVar34[8]);
          auVar96 = pmaddwd(auVar183,auVar150);
          auVar133._2_2_ = pCVar3[4];
          auVar133._0_2_ = auVar22._8_2_;
          auVar133._4_2_ = auVar22._10_2_;
          auVar133._6_2_ = pCVar3[5];
          auVar133._8_2_ = auVar22._12_2_;
          auVar133._10_2_ = pCVar3[6];
          auVar133._12_2_ = auVar22._14_2_;
          auVar133._14_2_ = pCVar3[7];
          auVar35._2_2_ = auVar14._8_2_ - CONCAT11(0,auVar34[0xc]);
          auVar35._0_2_ = CONCAT11(0,auVar34[0xc]);
          auVar35[4] = auVar34[0xd];
          auVar35[5] = 0;
          auVar35._6_2_ = auVar14._10_2_ - (ushort)auVar34[0xd];
          auVar35[8] = auVar34[0xe];
          auVar35[9] = 0;
          auVar35._10_2_ = auVar14._12_2_ - (ushort)auVar34[0xe];
          auVar35[0xc] = auVar34[0xf];
          auVar35[0xd] = 0;
          auVar35._14_2_ = auVar14._14_2_ - (ushort)auVar34[0xf];
          auVar68._0_4_ = auVar85._0_4_ + iVar10 * -0x40 >> auVar13;
          auVar68._4_4_ = auVar85._4_4_ + iVar10 * -0x40 >> auVar13;
          auVar68._8_4_ = auVar85._8_4_ + iVar10 * -0x40 >> auVar13;
          auVar68._12_4_ = auVar85._12_4_ + iVar10 * -0x40 >> auVar13;
          auVar15 = pmaddwd(auVar35,auVar133);
          in_XMM6._0_4_ = auVar94._0_4_ + iVar10 * -0x40 >> auVar13;
          in_XMM6._4_4_ = auVar94._4_4_ + iVar10 * -0x40 >> auVar13;
          in_XMM6._8_4_ = auVar94._8_4_ + iVar10 * -0x40 >> auVar13;
          in_XMM6._12_4_ = auVar94._12_4_ + iVar10 * -0x40 >> auVar13;
          auVar22 = packssdw(auVar68,in_XMM6);
          auVar188._0_4_ = auVar96._0_4_ + iVar10 * -0x40 >> auVar13;
          auVar188._4_4_ = auVar96._4_4_ + iVar10 * -0x40 >> auVar13;
          auVar188._8_4_ = auVar96._8_4_ + iVar10 * -0x40 >> auVar13;
          auVar188._12_4_ = auVar96._12_4_ + iVar10 * -0x40 >> auVar13;
          auVar36._0_4_ = auVar15._0_4_ + iVar10 * -0x40 >> auVar13;
          auVar36._4_4_ = auVar15._4_4_ + iVar10 * -0x40 >> auVar13;
          auVar36._8_4_ = auVar15._8_4_ + iVar10 * -0x40 >> auVar13;
          auVar36._12_4_ = auVar15._12_4_ + iVar10 * -0x40 >> auVar13;
          auVar15 = packssdw(auVar188,auVar36);
          sVar69 = auVar22._0_2_;
          sVar70 = auVar22._2_2_;
          sVar71 = auVar22._4_2_;
          sVar73 = auVar22._6_2_;
          sVar75 = auVar22._8_2_;
          sVar77 = auVar22._10_2_;
          sVar79 = auVar22._12_2_;
          sVar81 = auVar22._14_2_;
          sVar83 = auVar15._0_2_;
          sVar104 = auVar15._2_2_;
          sVar107 = auVar15._4_2_;
          sVar110 = auVar15._6_2_;
          sVar112 = auVar15._8_2_;
          sVar114 = auVar15._10_2_;
          sVar116 = auVar15._12_2_;
          sVar118 = auVar15._14_2_;
          puVar2 = dst + lVar11;
          *puVar2 = (0 < sVar69) * (sVar69 < 0x100) * auVar22[0] - (0xff < sVar69);
          puVar2[1] = (0 < sVar70) * (sVar70 < 0x100) * auVar22[2] - (0xff < sVar70);
          puVar2[2] = (0 < sVar71) * (sVar71 < 0x100) * auVar22[4] - (0xff < sVar71);
          puVar2[3] = (0 < sVar73) * (sVar73 < 0x100) * auVar22[6] - (0xff < sVar73);
          puVar2[4] = (0 < sVar75) * (sVar75 < 0x100) * auVar22[8] - (0xff < sVar75);
          puVar2[5] = (0 < sVar77) * (sVar77 < 0x100) * auVar22[10] - (0xff < sVar77);
          puVar2[6] = (0 < sVar79) * (sVar79 < 0x100) * auVar22[0xc] - (0xff < sVar79);
          puVar2[7] = (0 < sVar81) * (sVar81 < 0x100) * auVar22[0xe] - (0xff < sVar81);
          puVar2[8] = (0 < sVar83) * (sVar83 < 0x100) * auVar15[0] - (0xff < sVar83);
          puVar2[9] = (0 < sVar104) * (sVar104 < 0x100) * auVar15[2] - (0xff < sVar104);
          puVar2[10] = (0 < sVar107) * (sVar107 < 0x100) * auVar15[4] - (0xff < sVar107);
          puVar2[0xb] = (0 < sVar110) * (sVar110 < 0x100) * auVar15[6] - (0xff < sVar110);
          puVar2[0xc] = (0 < sVar112) * (sVar112 < 0x100) * auVar15[8] - (0xff < sVar112);
          puVar2[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar15[10] - (0xff < sVar114);
          puVar2[0xe] = (0 < sVar116) * (sVar116 < 0x100) * auVar15[0xc] - (0xff < sVar116);
          puVar2[0xf] = (0 < sVar118) * (sVar118 < 0x100) * auVar15[0xe] - (0xff < sVar118);
          lVar11 = lVar11 + 0x10;
        } while (lVar11 < w);
      }
      mask = mask + mask_stride * 2;
      dst = dst + dst_stride;
      iVar9 = iVar9 + 1;
      src1 = src1 + src1_stride;
      src0 = src0 + uVar6;
      puVar12 = puVar12 + mask_stride * 2;
    } while (iVar9 != h);
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  const int round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;

  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;
  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  const __m128i v_round_offset = _mm_set1_epi32(round_offset);

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  } else {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  }
}